

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po_test.cc
# Opt level: O3

void __thiscall
bool_implicit_and_explicit_options::test_method(bool_implicit_and_explicit_options *this)

{
  char **ppcVar1;
  options_boost_po *poVar2;
  undefined1 local_2af;
  bool bool_switch_unspecified;
  bool bool_switch;
  int argc;
  options_boost_po *local_2a8;
  char **local_2a0;
  undefined **local_298;
  ulong local_290;
  shared_count sStack_288;
  undefined1 **local_280;
  undefined1 *local_278;
  bool *local_270;
  byte local_268;
  undefined8 local_260;
  shared_count sStack_258;
  undefined1 *local_250;
  long local_248;
  undefined1 local_240 [16];
  option_group_definition arg_group;
  undefined1 local_1f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0 [7];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  string local_158;
  string local_138;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  undefined **local_e8;
  undefined1 local_e0;
  undefined8 *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  char command_line [18];
  
  builtin_strncpy(command_line,"exe --bool_switch",0x12);
  ppcVar1 = convert_to_command_args(command_line,&argc,0x40);
  local_2a0 = ppcVar1;
  poVar2 = (options_boost_po *)operator_new(0x2e8);
  VW::config::options_boost_po::options_boost_po(poVar2,argc,ppcVar1);
  local_2a8 = poVar2;
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"group","");
  arg_group.m_name._M_dataplus._M_p = (pointer)&arg_group.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&arg_group,local_250,local_250 + local_248);
  arg_group.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arg_group.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arg_group.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"bool_switch","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1f8,&local_138,&bool_switch);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>>
            (&arg_group,(typed_option<bool> *)local_1f8);
  local_1f8._0_8_ = &PTR__typed_option_00308c78;
  if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
  }
  if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"bool_switch_unspecified","")
  ;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1f8,&local_158,&bool_switch_unspecified);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>>
            (&arg_group,(typed_option<bool> *)local_1f8);
  local_1f8._0_8_ = &PTR__typed_option_00308c78;
  if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
  }
  if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  (**(poVar2->super_options_i)._vptr_options_i)(poVar2,&arg_group);
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0x6d);
  local_298 = (undefined **)CONCAT71(local_298._1_7_,1);
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_1f8[8] = 0;
  local_1f8._0_8_ = &PTR__lazy_ostream_00308f98;
  local_1f8._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1e0[0]._M_allocated_capacity = "no exceptions thrown by options->add_and_parse(arg_group)";
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_70 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_288);
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x6f);
  local_e0 = 0;
  local_e8 = &PTR__lazy_ostream_00308850;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_278 = &local_2af;
  local_2af = 1;
  local_268 = bool_switch;
  local_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_110 = "";
  local_1f8[8] = 0;
  local_1f8._0_8_ = &PTR__lazy_ostream_00308920;
  local_1f8._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_290 = local_290 & 0xffffffffffffff00;
  local_298 = &PTR__lazy_ostream_00308920;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = &local_278;
  local_270 = &bool_switch;
  local_1e0[0]._0_8_ = &local_270;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_258);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0x70);
  local_e0 = 0;
  local_e8 = &PTR__lazy_ostream_00308850;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_2af = 0;
  local_268 = bool_switch_unspecified ^ 1;
  local_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_110 = "";
  local_270 = &bool_switch_unspecified;
  local_1f8[8] = 0;
  local_1f8._0_8_ = &PTR__lazy_ostream_00308920;
  local_1f8._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_278 = &local_2af;
  local_290 = local_290 & 0xffffffffffffff00;
  local_298 = &PTR__lazy_ostream_00308920;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = &local_278;
  local_1e0[0]._0_8_ = &local_270;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_258);
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&arg_group.m_options);
  ppcVar1 = local_2a0;
  poVar2 = local_2a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg_group.m_name._M_dataplus._M_p != &arg_group.m_name.field_2) {
    operator_delete(arg_group.m_name._M_dataplus._M_p);
  }
  (*(poVar2->super_options_i)._vptr_options_i[9])(poVar2);
  operator_delete(ppcVar1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bool_implicit_and_explicit_options) {
  bool bool_switch;
  bool bool_switch_unspecified;

  char command_line[] = "exe --bool_switch";
  int argc;
  // Only the returned char* needs to be deleted as the individual pointers simply point into command_line.
  std::unique_ptr<char*> argv(convert_to_command_args(command_line, argc));

  std::unique_ptr<options_i> options = std::unique_ptr<options_boost_po>(
    new options_boost_po(argc, argv.get()));

  option_group_definition arg_group("group");
  arg_group.add(make_option("bool_switch", bool_switch));
  arg_group.add(make_option("bool_switch_unspecified", bool_switch_unspecified));

  BOOST_CHECK_NO_THROW(options->add_and_parse(arg_group));

  BOOST_CHECK_EQUAL(bool_switch, true);
  BOOST_CHECK_EQUAL(bool_switch_unspecified, false);
}